

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrMultisamplePixelBufferAccess.cpp
# Opt level: O0

void rr::resolveMultisampleColorBuffer
               (PixelBufferAccess *dst,MultisampleConstPixelBufferAccess *src)

{
  undefined4 uVar1;
  float fVar2;
  MultisampleConstPixelBufferAccess *pMVar3;
  int iVar4;
  int iVar5;
  ConstPixelBufferAccess *pCVar6;
  Vec4 local_80;
  undefined1 local_70 [24];
  int s;
  Vec4 sum;
  int x;
  int y;
  float numSamplesInv;
  MultisampleConstPixelBufferAccess *local_18;
  MultisampleConstPixelBufferAccess *src_local;
  PixelBufferAccess *dst_local;
  
  local_18 = src;
  src_local = (MultisampleConstPixelBufferAccess *)dst;
  iVar4 = MultisampleConstPixelBufferAccess::getNumSamples(src);
  pMVar3 = src_local;
  if (iVar4 == 1) {
    MultisampleConstPixelBufferAccess::toSinglesampleAccess((ConstPixelBufferAccess *)&y,local_18);
    tcu::copy((EVP_PKEY_CTX *)pMVar3,(EVP_PKEY_CTX *)&y);
  }
  else {
    iVar4 = MultisampleConstPixelBufferAccess::getNumSamples(local_18);
    for (sum.m_data[3] = 0.0; fVar2 = sum.m_data[3],
        iVar5 = tcu::ConstPixelBufferAccess::getHeight(&src_local->m_access), (int)fVar2 < iVar5;
        sum.m_data[3] = (float)((int)sum.m_data[3] + 1)) {
      for (sum.m_data[2] = 0.0; fVar2 = sum.m_data[2],
          iVar5 = tcu::ConstPixelBufferAccess::getWidth(&src_local->m_access), (int)fVar2 < iVar5;
          sum.m_data[2] = (float)((int)sum.m_data[2] + 1)) {
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_70 + 0x14));
        local_70._16_4_ = 0;
        while( true ) {
          uVar1 = local_70._16_4_;
          pCVar6 = MultisampleConstPixelBufferAccess::raw(local_18);
          iVar5 = tcu::ConstPixelBufferAccess::getWidth(pCVar6);
          pMVar3 = src_local;
          if (iVar5 <= (int)uVar1) break;
          pCVar6 = MultisampleConstPixelBufferAccess::raw(local_18);
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_70,(int)pCVar6,local_70._16_4_,
                     (int)sum.m_data[2]);
          tcu::Vector<float,_4>::operator+=
                    ((Vector<float,_4> *)(local_70 + 0x14),(Vector<float,_4> *)local_70);
          local_70._16_4_ = local_70._16_4_ + 1;
        }
        tcu::operator*((tcu *)&local_80,(Vector<float,_4> *)(local_70 + 0x14),1.0 / (float)iVar4);
        tcu::PixelBufferAccess::setPixel
                  ((PixelBufferAccess *)pMVar3,&local_80,(int)sum.m_data[2],(int)sum.m_data[3],0);
      }
    }
  }
  return;
}

Assistant:

void resolveMultisampleColorBuffer (const tcu::PixelBufferAccess& dst, const MultisampleConstPixelBufferAccess& src)
{
	DE_ASSERT(dst.getWidth() == src.raw().getHeight());
	DE_ASSERT(dst.getHeight() == src.raw().getDepth());

	if (src.getNumSamples() == 1)
	{
		// fast-path for non-multisampled cases
		tcu::copy(dst, src.toSinglesampleAccess());
	}
	else
	{
		const float numSamplesInv = 1.0f / (float)src.getNumSamples();

		for (int y = 0; y < dst.getHeight(); y++)
		for (int x = 0; x < dst.getWidth(); x++)
		{
			tcu::Vec4 sum;
			for (int s = 0; s < src.raw().getWidth(); s++)
				sum += src.raw().getPixel(s, x, y);

			dst.setPixel(sum*numSamplesInv, x, y);
		}
	}
}